

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t sblines(Terminal *term)

{
  wchar_t local_14;
  wchar_t sblines;
  Terminal *term_local;
  
  local_14 = count234(term->scrollback);
  if ((((term->erase_to_scrollback & 1U) != 0) && (term->alt_which != L'\0')) &&
     (term->alt_screen != (tree234 *)0x0)) {
    local_14 = term->alt_sblines + local_14;
  }
  return local_14;
}

Assistant:

static int sblines(Terminal *term)
{
    int sblines = count234(term->scrollback);
    if (term->erase_to_scrollback &&
        term->alt_which && term->alt_screen) {
            sblines += term->alt_sblines;
    }
    return sblines;
}